

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  TargetType TVar1;
  bool bVar2;
  ImportInfo *pIVar3;
  char *__s;
  ManagedType MVar4;
  allocator<char> local_39;
  string local_38;
  
  TVar1 = this->Target->TargetTypeValue;
  MVar4 = Undefined;
  if ((int)TVar1 < 3) {
    if (TVar1 == STATIC_LIBRARY) {
      MVar4 = Native;
    }
    else if (this->Target->IsImportedTarget == true) {
      pIVar3 = GetImportInfo(this,config);
      MVar4 = Undefined;
      if (pIVar3 != (ImportInfo *)0x0) {
        MVar4 = pIVar3->Managed;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"COMMON_LANGUAGE_RUNTIME",&local_39);
      __s = GetProperty(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (__s == (char *)0x0) {
        bVar2 = IsCSharpOnly(this);
        MVar4 = (uint)bVar2 * 2 + Native;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
        MVar4 = Managed - (local_38._M_string_length == 0);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
  }
  return MVar4;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}